

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  stbtt__active_edge *psVar1;
  float *scanline;
  int iVar2;
  uint uVar3;
  uint uVar4;
  stbtt__active_edge *z;
  ulong uVar5;
  stbtt__point *points;
  long lVar6;
  stbtt__edge *psVar7;
  undefined8 *puVar8;
  long *plVar9;
  uchar uVar10;
  uint uVar11;
  long lVar12;
  stbtt__active_edge *psVar13;
  stbtt__active_edge *psVar14;
  int iVar15;
  undefined8 *puVar16;
  undefined1 e [8];
  stbtt__edge *psVar17;
  stbtt__point *__ptr;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  void *p;
  stbtt__active_edge *psVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ulong local_308;
  int local_300;
  stbtt__active_edge *local_100;
  undefined1 local_f8 [16];
  float local_e0;
  int local_dc;
  stbtt__edge *local_d8;
  ulong local_d0;
  undefined8 *local_c8;
  stbtt__bitmap *local_c0;
  stbtt__point *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  stbtt__active_edge *active;
  float local_88;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  stbtt__point *local_68;
  stbtt__edge *local_60;
  float local_58;
  float local_54;
  int local_50;
  float local_4c;
  float *pfStack_48;
  float y0;
  float local_3c;
  float local_38;
  float local_34;
  
  local_a8._0_4_ = shift_x;
  local_88 = scale_y;
  if (scale_x <= scale_y) {
    local_88 = scale_x;
  }
  uVar5 = 0;
  uVar18 = (ulong)(uint)num_verts;
  if (num_verts < 1) {
    uVar18 = uVar5;
  }
  uVar11 = 0;
  for (; uVar18 * 10 - uVar5 != 0; uVar5 = uVar5 + 10) {
    uVar11 = uVar11 + ((&vertices->type)[uVar5] == '\x01');
  }
  if (uVar11 != 0) {
    local_f8._8_8_ = local_f8._0_8_;
    local_f8._0_8_ = CONCAT44(0,uVar11);
    local_c0 = result;
    local_78 = scale_y;
    uStack_74 = in_XMM2_Db;
    uStack_70 = in_XMM2_Dc;
    uStack_6c = in_XMM2_Dd;
    local_58 = shift_y;
    local_3c = flatness_in_pixels;
    local_38 = (float)invert;
    local_34 = scale_x;
    local_68 = (stbtt__point *)malloc(CONCAT44(0,uVar11) * 4);
    if (local_68 != (stbtt__point *)0x0) {
      local_d8 = (stbtt__edge *)CONCAT44(local_d8._4_4_,x_off);
      local_3c = (local_3c / local_88) * (local_3c / local_88);
      pfStack_48 = (float *)&local_308;
      points = (stbtt__point *)0x0;
      fVar22 = 0.0;
      fVar23 = 0.0;
      fVar26 = 0.0;
      local_d0 = (ulong)(uint)y_off;
      do {
        if (fVar23 == 1.4013e-45) {
          points = (stbtt__point *)malloc((long)(int)fVar26 << 3);
          __ptr = local_68;
          if (points == (stbtt__point *)0x0) goto LAB_00112666;
        }
        else if (fVar23 == 2.8026e-45) {
          if (points == (stbtt__point *)0x0) {
            return;
          }
          iVar2 = 0;
          for (lVar12 = 0; local_f8._0_8_ != lVar12; lVar12 = lVar12 + 1) {
            iVar2 = iVar2 + (int)(&local_68->x)[lVar12];
          }
          if (local_38 != 0.0) {
            local_78 = -local_78;
            uStack_74 = uStack_74 ^ 0x80000000;
            uStack_70 = uStack_70 ^ 0x80000000;
            uStack_6c = uStack_6c ^ 0x80000000;
          }
          local_b8 = points;
          psVar7 = (stbtt__edge *)malloc((long)(iVar2 + 1) * 0x14);
          local_60 = psVar7;
          if (psVar7 != (stbtt__edge *)0x0) {
            iVar2 = 0;
            iVar15 = 0;
            for (lVar12 = 0; lVar12 != local_f8._0_8_; lVar12 = lVar12 + 1) {
              fVar22 = (&local_68->x)[lVar12];
              uVar5 = (ulong)((int)fVar22 - 1);
              uVar18 = 0;
              if (0 < (int)fVar22) {
                uVar18 = (ulong)(uint)fVar22;
              }
              for (uVar19 = 0; iVar20 = (int)uVar5, uVar18 != uVar19; uVar19 = uVar19 + 1) {
                uVar5 = (ulong)iVar20;
                fVar26 = local_b8[(long)iVar2 + uVar5].y;
                fVar23 = local_b8[(long)iVar2 + uVar19].y;
                if ((fVar26 != fVar23) || (NAN(fVar26) || NAN(fVar23))) {
                  psVar17 = psVar7 + iVar15;
                  psVar7[iVar15].invert = 0;
                  if (local_38 == 0.0) {
                    if (fVar23 <= fVar26) goto LAB_00111c24;
LAB_00111c12:
                    psVar17->invert = 1;
                    uVar5 = uVar19;
                  }
                  else {
                    if (fVar23 < fVar26) goto LAB_00111c12;
LAB_00111c24:
                    iVar20 = (int)uVar19;
                  }
                  psVar17->x0 = local_b8[(long)iVar2 + (long)iVar20].x * local_34 +
                                (float)local_a8._0_4_;
                  psVar17->y0 = local_b8[(long)iVar2 + (long)iVar20].y * local_78 + local_58;
                  psVar17->x1 = local_b8[(long)iVar2 + uVar5].x * local_34 + (float)local_a8._0_4_;
                  psVar17->y1 = local_b8[(long)iVar2 + uVar5].y * local_78 + local_58;
                  iVar15 = iVar15 + 1;
                }
                uVar5 = uVar19 & 0xffffffff;
              }
              iVar2 = (int)fVar22 + iVar2;
            }
            stbtt__sort_edges_quicksort(psVar7,iVar15);
            for (uVar18 = 1; (long)uVar18 < (long)iVar15; uVar18 = uVar18 + 1) {
              fVar22 = local_60[uVar18].x0;
              fVar26 = local_60[uVar18].y0;
              local_300 = local_60[uVar18].invert;
              local_308._0_4_ = local_60[uVar18].x1;
              local_308._4_4_ = local_60[uVar18].y1;
              psVar17 = psVar7;
              for (uVar5 = uVar18; 0 < (long)uVar5; uVar5 = uVar5 - 1) {
                if (psVar17->y0 <= fVar26) goto LAB_00111d1b;
                psVar17[1].invert = psVar17->invert;
                fVar23 = psVar17->y0;
                fVar27 = psVar17->x1;
                fVar24 = psVar17->y1;
                psVar17[1].x0 = psVar17->x0;
                psVar17[1].y0 = fVar23;
                psVar17[1].x1 = fVar27;
                psVar17[1].y1 = fVar24;
                psVar17 = psVar17 + -1;
              }
              uVar5 = 0;
LAB_00111d1b:
              iVar2 = (int)uVar5;
              if (uVar18 != (uVar5 & 0xffffffff)) {
                local_60[iVar2].x0 = fVar22;
                local_60[iVar2].y0 = fVar26;
                local_60[iVar2].x1 = (float)local_308;
                local_60[iVar2].y1 = (float)local_308._4_4_;
                local_60[iVar2].invert = local_300;
              }
              psVar7 = psVar7 + 1;
            }
            local_98 = (undefined1  [8])0x0;
            lVar12 = (long)local_c0->w;
            if (0x40 < lVar12) {
              pfStack_48 = (float *)malloc((ulong)(uint)local_c0->w * 8 + 4);
            }
            iVar2 = local_c0->h;
            active = (stbtt__active_edge *)(pfStack_48 + lVar12);
            local_60[iVar15].y0 = (float)(iVar2 + (int)local_d0) + 1.0;
            local_e0 = (float)(int)local_d8;
            psVar21 = (stbtt__active_edge *)0x0;
            local_50 = 0;
            local_c8 = (undefined8 *)0x0;
            iVar15 = 0;
            uVar18 = local_d0;
            psVar7 = local_60;
            local_b0 = lVar12;
            while (psVar14 = active, puVar16 = local_c8, iVar15 < iVar2) {
              local_4c = (float)(int)uVar18;
              local_34 = local_4c + 1.0;
              lVar12 = (long)(int)local_b0;
              local_dc = iVar15;
              local_d0 = uVar18;
              memset(pfStack_48,0,lVar12 * 4);
              memset(psVar14,0,lVar12 * 4 + 4);
              fVar22 = local_4c;
              psVar14 = (stbtt__active_edge *)local_98;
              while (psVar13 = psVar14, psVar1 = psVar13->next, puVar16 = local_c8,
                    psVar1 != (stbtt__active_edge *)0x0) {
                psVar14 = psVar1;
                if (psVar1->ey <= fVar22) {
                  psVar13->next = psVar1->next;
                  if ((psVar1->direction == 0.0) && (!NAN(psVar1->direction))) {
                    __assert_fail("z->direction",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                  ,0x843,
                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                 );
                  }
                  psVar1->direction = 0.0;
                  psVar1->next = psVar21;
                  psVar14 = psVar13;
                  psVar21 = psVar1;
                }
              }
              for (; fVar26 = psVar7->y0, fVar26 <= local_34; psVar7 = psVar7 + 1) {
                fVar23 = psVar7->y1;
                puVar8 = puVar16;
                if ((fVar26 != fVar23) || (psVar14 = psVar21, NAN(fVar26) || NAN(fVar23))) {
                  if (psVar21 == (stbtt__active_edge *)0x0) {
                    if (local_50 == 0) {
                      local_88 = fVar26;
                      local_3c = fVar23;
                      puVar8 = (undefined8 *)malloc(0x6408);
                      if (puVar8 == (undefined8 *)0x0) goto LAB_001126bb;
                      *puVar8 = puVar16;
                      psVar21 = (stbtt__active_edge *)(puVar8 + 0xc7c);
                      local_50 = 799;
                      psVar14 = (stbtt__active_edge *)0x0;
                      fVar26 = local_88;
                      fVar22 = local_4c;
                      fVar23 = local_3c;
                    }
                    else {
                      if (puVar16 == (undefined8 *)0x0) {
LAB_001126bb:
                        __assert_fail("z != __null",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                      ,0x6b2,
                                      "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                     );
                      }
                      lVar12 = (long)local_50;
                      local_50 = local_50 + -1;
                      psVar21 = (stbtt__active_edge *)(puVar16 + lVar12 * 4 + -4);
                      psVar14 = (stbtt__active_edge *)0x0;
                    }
                  }
                  else {
                    psVar14 = psVar21->next;
                  }
                  fVar27 = psVar7->x0;
                  fVar24 = (psVar7->x1 - fVar27) / (fVar23 - fVar26);
                  psVar21->fdx = fVar24;
                  psVar21->fdy = (float)(-(uint)(fVar24 != 0.0) & (uint)(1.0 / fVar24));
                  psVar21->fx = ((fVar22 - fVar26) * fVar24 + fVar27) - local_e0;
                  psVar21->direction = *(float *)(&DAT_001255e0 + (ulong)(psVar7->invert == 0) * 4);
                  psVar21->sy = fVar26;
                  psVar21->ey = fVar23;
                  psVar21->next = (stbtt__active_edge *)0x0;
                  if (fVar23 < fVar22) {
                    __assert_fail("z->ey >= scan_y_top",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                  ,0x850,
                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                 );
                  }
                  psVar21->next = (stbtt__active_edge *)local_98;
                  local_98 = (undefined1  [8])psVar21;
                }
                puVar16 = puVar8;
                psVar21 = psVar14;
              }
              local_c8 = puVar16;
              if (local_98 != (undefined1  [8])0x0) {
                iVar15 = (int)local_b0;
                local_54 = (float)iVar15;
                e = local_98;
                local_100 = psVar21;
                local_d8 = psVar7;
                iVar2 = 0;
                if (0 < iVar15) {
                  iVar2 = iVar15;
                }
                for (; psVar21 = local_100, psVar7 = local_d8, e != (undefined1  [8])0x0;
                    e = (undefined1  [8])((stbtt__active_edge *)e)->next) {
                  fVar26 = ((stbtt__active_edge *)e)->ey;
                  if (fVar26 < fVar22) {
                    __assert_fail("e->ey >= y_top",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                  ,0x786,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  fVar23 = ((stbtt__active_edge *)e)->fx;
                  fVar27 = ((stbtt__active_edge *)e)->fdx;
                  if ((fVar27 != 0.0) || (NAN(fVar27))) {
                    fVar24 = ((stbtt__active_edge *)e)->sy;
                    if (local_34 < fVar24) {
                      __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                    ,0x799,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar30 = fVar27 + fVar23;
                    fVar25 = (float)(~-(uint)(fVar22 < fVar24) & (uint)fVar23 |
                                    (uint)((fVar24 - fVar22) * fVar27 + fVar23) &
                                    -(uint)(fVar22 < fVar24));
                    if ((((fVar25 < 0.0) ||
                         (fVar29 = (float)(~-(uint)(fVar26 < local_34) & (uint)fVar30 |
                                          (uint)((fVar26 - fVar22) * fVar27 + fVar23) &
                                          -(uint)(fVar26 < local_34)), fVar29 < 0.0)) ||
                        (local_54 <= fVar25)) || (local_54 <= fVar29)) {
                      local_f8 = ZEXT416((uint)fVar23);
                      local_a8 = ZEXT416((uint)fVar30);
                      local_58 = fVar27;
                      iVar15 = 0;
                      while (scanline = pfStack_48, iVar2 != iVar15) {
                        local_3c = (float)iVar15;
                        fVar27 = (float)(iVar15 + 1);
                        local_88 = (local_3c - fVar23) / local_58 + fVar22;
                        fVar26 = (fVar27 - fVar23) / local_58 + fVar22;
                        if ((local_3c <= fVar23) || (fVar30 <= fVar27)) {
                          if ((fVar30 < local_3c) && (fVar27 < fVar23)) {
                            local_78 = fVar26;
                            local_38 = fVar27;
                            stbtt__handle_clipped_edge
                                      (pfStack_48,iVar15,(stbtt__active_edge *)e,fVar23,fVar22,
                                       fVar27,fVar26);
                            fVar23 = local_38;
                            fVar22 = local_78;
LAB_001122ed:
                            stbtt__handle_clipped_edge
                                      (scanline,iVar15,(stbtt__active_edge *)e,fVar23,fVar22,
                                       local_3c,local_88);
                            fVar23 = local_3c;
                            fVar22 = local_88;
                            goto LAB_00112305;
                          }
                          if (((fVar23 < local_3c) && (local_3c < fVar30)) ||
                             ((fVar30 < local_3c && (local_3c < fVar23)))) goto LAB_001122ed;
                          if (((fVar23 < fVar27) && (fVar27 < fVar30)) ||
                             ((fVar30 < fVar27 && (fVar27 < fVar23)))) goto LAB_00112253;
                        }
                        else {
                          local_78 = fVar26;
                          local_38 = fVar27;
                          stbtt__handle_clipped_edge
                                    (pfStack_48,iVar15,(stbtt__active_edge *)e,fVar23,fVar22,
                                     local_3c,local_88);
                          fVar23 = local_3c;
                          fVar22 = local_88;
                          fVar26 = local_78;
                          fVar27 = local_38;
LAB_00112253:
                          local_38 = fVar27;
                          local_78 = fVar26;
                          stbtt__handle_clipped_edge
                                    (scanline,iVar15,(stbtt__active_edge *)e,fVar23,fVar22,local_38,
                                     local_78);
                          fVar23 = local_38;
                          fVar22 = local_78;
LAB_00112305:
                          fVar30 = (float)local_a8._0_4_;
                        }
                        stbtt__handle_clipped_edge
                                  (scanline,iVar15,(stbtt__active_edge *)e,fVar23,fVar22,fVar30,
                                   local_34);
                        fVar23 = (float)local_f8._0_4_;
                        fVar30 = (float)local_a8._0_4_;
                        fVar22 = local_4c;
                        iVar15 = iVar15 + 1;
                      }
                    }
                    else {
                      if (fVar24 <= fVar22) {
                        fVar24 = fVar22;
                      }
                      uVar11 = (uint)fVar25;
                      if (local_34 <= fVar26) {
                        fVar26 = local_34;
                      }
                      uVar3 = (uint)fVar29;
                      if (uVar11 == uVar3) {
                        if (((int)uVar11 < 0) || ((int)local_b0 <= (int)uVar11)) {
                          __assert_fail("x >= 0 && x < len",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                        ,0x7b5,
                                        "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                       );
                        }
                        fVar23 = ((stbtt__active_edge *)e)->direction;
                        uVar18 = (ulong)uVar11;
                        pfStack_48[uVar18] =
                             (((fVar29 - (float)(int)uVar11) + (fVar25 - (float)(int)uVar11)) * -0.5
                             + 1.0) * fVar23 * (fVar26 - fVar24) + pfStack_48[uVar18];
                        fVar23 = (fVar26 - fVar24) * fVar23;
                      }
                      else {
                        fVar27 = ((stbtt__active_edge *)e)->fdy;
                        fVar28 = fVar29;
                        uVar4 = uVar11;
                        if (fVar29 < fVar25) {
                          fVar23 = fVar22 - fVar24;
                          fVar24 = (fVar22 - fVar26) + local_34;
                          fVar27 = -fVar27;
                          fVar26 = fVar23 + local_34;
                          fVar28 = fVar25;
                          fVar23 = fVar30;
                          uVar4 = uVar3;
                          uVar3 = uVar11;
                          fVar25 = fVar29;
                        }
                        iVar15 = uVar4 + 1;
                        fVar29 = ((float)iVar15 - fVar23) * fVar27 + fVar22;
                        fVar23 = ((stbtt__active_edge *)e)->direction;
                        fVar30 = (fVar29 - fVar24) * fVar23;
                        pfStack_48[(int)uVar4] =
                             (1.0 - ((fVar25 - (float)(int)uVar4) + 1.0) * 0.5) * fVar30 +
                             pfStack_48[(int)uVar4];
                        uVar18 = (ulong)(int)uVar3;
                        for (lVar12 = (long)iVar15; lVar12 < (long)uVar18; lVar12 = lVar12 + 1) {
                          pfStack_48[lVar12] = fVar27 * fVar23 * 0.5 + fVar30 + pfStack_48[lVar12];
                          fVar30 = fVar30 + fVar27 * fVar23;
                        }
                        if (1.01 < ABS(fVar30)) {
                          __assert_fail("fabs(area) <= 1.01f",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                        ,0x7da,
                                        "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                       );
                        }
                        pfStack_48[uVar18] =
                             (fVar26 - (fVar27 * (float)(int)(uVar3 - iVar15) + fVar29)) *
                             (((fVar28 - (float)(int)uVar3) + 0.0) * -0.5 + 1.0) * fVar23 + fVar30 +
                             pfStack_48[uVar18];
                        fVar23 = (fVar26 - fVar24) * fVar23;
                      }
                      *(float *)((long)&active->next + uVar18 * 4 + 4) =
                           fVar23 + *(float *)((long)&active->next + uVar18 * 4 + 4);
                    }
                  }
                  else if (fVar23 < local_54) {
                    if (0.0 <= fVar23) {
                      local_f8 = ZEXT416((uint)fVar23);
                      stbtt__handle_clipped_edge
                                (pfStack_48,(int)fVar23,(stbtt__active_edge *)e,fVar23,fVar22,fVar23
                                 ,local_34);
                      iVar15 = (int)fVar23 + 1;
                      fVar22 = local_4c;
                      fVar23 = (float)local_f8._0_4_;
                    }
                    else {
                      iVar15 = 0;
                    }
                    stbtt__handle_clipped_edge
                              ((float *)active,iVar15,(stbtt__active_edge *)e,fVar23,fVar22,fVar23,
                               local_34);
                    fVar22 = local_4c;
                  }
                }
              }
              fVar22 = 0.0;
              for (lVar12 = 0; local_b0 = (long)local_c0->w, lVar12 < local_b0; lVar12 = lVar12 + 1)
              {
                fVar22 = fVar22 + *(float *)((long)&active->next + lVar12 * 4);
                iVar2 = (int)(ABS(pfStack_48[lVar12] + fVar22) * 255.0 + 0.5);
                uVar10 = (uchar)iVar2;
                if (0xfe < iVar2) {
                  uVar10 = 0xff;
                }
                local_c0->pixels[lVar12 + (long)local_dc * (long)local_c0->stride] = uVar10;
              }
              plVar9 = (long *)local_98;
              while (plVar9 = (long *)*plVar9, plVar9 != (long *)0x0) {
                *(float *)(plVar9 + 1) = *(float *)((long)plVar9 + 0xc) + *(float *)(plVar9 + 1);
              }
              uVar18 = (ulong)((int)local_d0 + 1);
              iVar2 = local_c0->h;
              iVar15 = local_dc + 1;
            }
            while (puVar16 != (undefined8 *)0x0) {
              puVar8 = (undefined8 *)*puVar16;
              free(puVar16);
              puVar16 = puVar8;
            }
            if (pfStack_48 != (float *)&local_308) {
              free(pfStack_48);
            }
            free(local_60);
          }
          free(local_68);
          __ptr = local_b8;
LAB_00112666:
          free(__ptr);
          return;
        }
        local_308 = local_308 & 0xffffffff00000000;
        fVar26 = 0.0;
        uVar11 = 0xffffffff;
        fVar27 = 0.0;
        local_4c = fVar23;
        for (lVar12 = 0; fVar23 = (float)local_308, uVar18 * 10 != lVar12; lVar12 = lVar12 + 10) {
          uVar10 = (&vertices->type)[lVar12];
          if (uVar10 == '\x03') {
            local_88 = fVar22;
            stbtt__tesselate_curve
                      (points,(int *)&local_308,fVar26,fVar27,
                       (float)(int)*(short *)((long)&vertices->cx + lVar12),
                       (float)(int)*(short *)((long)&vertices->cy + lVar12),
                       (float)(int)*(short *)((long)&vertices->x + lVar12),
                       (float)(int)*(short *)((long)&vertices->y + lVar12),local_3c,0);
            fVar26 = (float)(int)*(short *)((long)&vertices->x + lVar12);
            fVar27 = (float)(int)*(short *)((long)&vertices->y + lVar12);
            fVar22 = local_88;
          }
          else if (uVar10 == '\x02') {
            fVar26 = (float)(int)*(short *)((long)&vertices->x + lVar12);
            fVar27 = (float)(int)*(short *)((long)&vertices->y + lVar12);
            lVar6 = (long)(int)(float)local_308;
            local_308 = CONCAT44(local_308._4_4_,(int)(float)local_308 + 1);
            if (points != (stbtt__point *)0x0) {
              points[lVar6].x = fVar26;
              points[lVar6].y = fVar27;
            }
          }
          else if (uVar10 == '\x01') {
            if (-1 < (int)uVar11) {
              (&local_68->x)[uVar11] = (float)((int)(float)local_308 - (int)fVar22);
            }
            fVar26 = (float)(int)*(short *)((long)&vertices->x + lVar12);
            fVar27 = (float)(int)*(short *)((long)&vertices->y + lVar12);
            uVar11 = uVar11 + 1;
            local_308 = CONCAT44(local_308._4_4_,(int)(float)local_308 + 1);
            fVar22 = fVar23;
            if (points != (stbtt__point *)0x0) {
              points[(int)fVar23].x = fVar26;
              points[(int)fVar23].y = fVar27;
            }
          }
        }
        (&local_68->x)[(int)uVar11] = (float)((int)(float)local_308 - (int)fVar22);
        fVar23 = (float)((int)local_4c + 1);
        fVar26 = (float)local_308;
      } while( true );
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale = scale_x > scale_y ? scale_y : scale_x;
   int winding_count, *winding_lengths;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}